

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

string * __thiscall
ncnn::ParamDict::get(string *__return_storage_ptr__,ParamDict *this,int id,string *def)

{
  pointer pcVar1;
  anon_struct_112_4_78a8b69f *paVar2;
  
  paVar2 = this->d->params + id;
  if (paVar2->type != 0) {
    def = &paVar2->s;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (def->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + def->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ParamDict::get(int id, const std::string& def) const
{
    return d->params[id].type ? d->params[id].s : def;
}